

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O3

cmArgumentParser<cmCoreTryCompile::Arguments> *
anon_unknown.dwarf_245fb95::makeTryCompileParser
          (cmArgumentParser<cmCoreTryCompile::Arguments> *__return_storage_ptr__,
          cmArgumentParser<cmCoreTryCompile::Arguments> *base)

{
  ActionMap *pAVar1;
  cmArgumentParser<cmCoreTryCompile::Arguments> *extraout_RAX;
  static_string_view name;
  ActionMap local_80;
  
  ArgumentParser::ActionMap::ActionMap(&local_80,(ActionMap *)base);
  name.super_string_view._M_str = "OUTPUT_VARIABLE";
  name.super_string_view._M_len = 0xf;
  pAVar1 = (ActionMap *)
           cmArgumentParser<cmCoreTryCompile::Arguments>::Bind<std::optional<std::__cxx11::string>>
                     ((cmArgumentParser<cmCoreTryCompile::Arguments> *)&local_80,name,0x260);
  ArgumentParser::ActionMap::ActionMap((ActionMap *)__return_storage_ptr__,pAVar1);
  std::
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::~vector(&local_80.Positions.
             super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
           );
  if (local_80.ParsedKeyword.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_80.ParsedKeyword.super__Function_base._M_manager)
              ((_Any_data *)&local_80.ParsedKeyword,(_Any_data *)&local_80.ParsedKeyword,
               __destroy_functor);
  }
  if (local_80.KeywordMissingValue.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_80.KeywordMissingValue.super__Function_base._M_manager)
              ((_Any_data *)&local_80.KeywordMissingValue,(_Any_data *)&local_80.KeywordMissingValue
               ,__destroy_functor);
  }
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             *)&local_80);
  return extraout_RAX;
}

Assistant:

cmArgumentParser<Arguments> makeTryCompileParser(
  const cmArgumentParser<Arguments>& base)
{
  return cmArgumentParser<Arguments>{ base }.Bind("OUTPUT_VARIABLE"_s,
                                                  &Arguments::OutputVariable);
}